

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

void __thiscall Assimp::ASEImporter::BuildMaterialIndices(ASEImporter *this)

{
  uint *puVar1;
  Material *mat;
  aiMesh *paVar2;
  long lVar3;
  pointer pMVar4;
  pointer pMVar5;
  aiMaterial **ppaVar6;
  aiColor4D *paVar7;
  uint uVar8;
  ulong uVar9;
  aiColor4D *paVar10;
  ulong uVar11;
  aiScene *paVar12;
  ulong uVar13;
  pointer pMVar14;
  bool bVar15;
  
  paVar12 = this->pcScene;
  if (paVar12 == (aiScene *)0x0) {
    __assert_fail("__null != pcScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                  ,0x4cb,"void Assimp::ASEImporter::BuildMaterialIndices()");
  }
  pMVar4 = (this->mParser->m_vMaterials).
           super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->mParser->m_vMaterials).
      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar4) {
    uVar13 = 0;
    do {
      mat = pMVar4 + uVar13;
      if (pMVar4[uVar13].bNeed == true) {
        ConvertMaterial(this,mat);
        puVar1 = &this->pcScene->mNumMaterials;
        *puVar1 = *puVar1 + 1;
      }
      pMVar4 = (mat->avSubMaterials).
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pMVar5 = (mat->avSubMaterials).
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pMVar5 != pMVar4) {
        uVar9 = 0;
        uVar11 = 1;
        do {
          if (pMVar4[uVar9].bNeed == true) {
            ConvertMaterial(this,pMVar4 + uVar9);
            puVar1 = &this->pcScene->mNumMaterials;
            *puVar1 = *puVar1 + 1;
            pMVar4 = (mat->avSubMaterials).
                     super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar5 = (mat->avSubMaterials).
                     super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar9 = ((long)pMVar5 - (long)pMVar4 >> 5) * -0x2c8590b21642c859;
          bVar15 = uVar11 <= uVar9;
          lVar3 = uVar9 - uVar11;
          uVar9 = uVar11;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (bVar15 && lVar3 != 0);
      }
      uVar13 = (ulong)((int)uVar13 + 1);
      pMVar4 = (this->mParser->m_vMaterials).
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(this->mParser->m_vMaterials).
                     super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 5) *
              -0x2c8590b21642c859;
    } while (uVar13 <= uVar9 && uVar9 - uVar13 != 0);
    paVar12 = this->pcScene;
  }
  ppaVar6 = (aiMaterial **)operator_new__((ulong)paVar12->mNumMaterials << 3);
  paVar12->mMaterials = ppaVar6;
  pMVar4 = (this->mParser->m_vMaterials).
           super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->mParser->m_vMaterials).
      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar4) {
    paVar7 = (aiColor4D *)0x0;
    uVar8 = 0;
    do {
      if (pMVar4[(long)paVar7].bNeed == true) {
        if (pMVar4[(long)paVar7].pcInstance == (aiMaterial *)0x0) {
          __assert_fail("__null != mat.pcInstance",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                        ,0x4ea,"void Assimp::ASEImporter::BuildMaterialIndices()");
        }
        this->pcScene->mMaterials[uVar8] = pMVar4[(long)paVar7].pcInstance;
        paVar12 = this->pcScene;
        if (paVar12->mNumMeshes != 0) {
          uVar13 = 0;
          do {
            paVar2 = paVar12->mMeshes[uVar13];
            if ((paVar2->mMaterialIndex == 0xffffffff) && (paVar7 == paVar2->mColors[3])) {
              paVar2->mMaterialIndex = uVar8;
              paVar2->mColors[3] = (aiColor4D *)0x0;
              paVar12 = this->pcScene;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < paVar12->mNumMeshes);
        }
        uVar8 = uVar8 + 1;
      }
      pMVar5 = pMVar4[(long)paVar7].avSubMaterials.
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pMVar14 = pMVar4[(long)paVar7].avSubMaterials.
                super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pMVar14 != pMVar5) {
        uVar13 = 0;
        do {
          if (pMVar5[uVar13].bNeed == true) {
            if (pMVar5[uVar13].pcInstance == (aiMaterial *)0x0) {
              __assert_fail("__null != submat.pcInstance",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                            ,0x501,"void Assimp::ASEImporter::BuildMaterialIndices()");
            }
            this->pcScene->mMaterials[uVar8] = pMVar5[uVar13].pcInstance;
            paVar12 = this->pcScene;
            if (paVar12->mNumMeshes != 0) {
              uVar9 = 0;
              do {
                paVar2 = paVar12->mMeshes[uVar9];
                if (((uint)uVar13 == paVar2->mMaterialIndex) && (paVar7 == paVar2->mColors[3])) {
                  paVar2->mMaterialIndex = uVar8;
                  paVar2->mColors[3] = (aiColor4D *)0x0;
                  paVar12 = this->pcScene;
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < paVar12->mNumMeshes);
            }
            uVar8 = uVar8 + 1;
            pMVar5 = pMVar4[(long)paVar7].avSubMaterials.
                     super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar14 = pMVar4[(long)paVar7].avSubMaterials.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar13 = (ulong)((uint)uVar13 + 1);
          uVar9 = ((long)pMVar14 - (long)pMVar5 >> 5) * -0x2c8590b21642c859;
        } while (uVar13 <= uVar9 && uVar9 - uVar13 != 0);
      }
      paVar7 = (aiColor4D *)(ulong)((int)paVar7 + 1);
      pMVar4 = (this->mParser->m_vMaterials).
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      paVar10 = (aiColor4D *)
                (((long)(this->mParser->m_vMaterials).
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 5) *
                -0x2c8590b21642c859);
    } while (paVar7 <= paVar10 && (long)paVar10 - (long)paVar7 != 0);
  }
  return;
}

Assistant:

void ASEImporter::BuildMaterialIndices()
{
    ai_assert(NULL != pcScene);

    // iterate through all materials and check whether we need them
    for (unsigned int iMat = 0; iMat < mParser->m_vMaterials.size();++iMat)
    {
        ASE::Material& mat = mParser->m_vMaterials[iMat];
        if (mat.bNeed)  {
            // Convert it to the aiMaterial layout
            ConvertMaterial(mat);
            ++pcScene->mNumMaterials;
        }
        for (unsigned int iSubMat = 0; iSubMat < mat.avSubMaterials.size();++iSubMat)
        {
            ASE::Material& submat = mat.avSubMaterials[iSubMat];
            if (submat.bNeed)   {
                // Convert it to the aiMaterial layout
                ConvertMaterial(submat);
                ++pcScene->mNumMaterials;
            }
        }
    }

    // allocate the output material array
    pcScene->mMaterials = new aiMaterial*[pcScene->mNumMaterials];
    D3DS::Material** pcIntMaterials = new D3DS::Material*[pcScene->mNumMaterials];

    unsigned int iNum = 0;
    for (unsigned int iMat = 0; iMat < mParser->m_vMaterials.size();++iMat) {
        ASE::Material& mat = mParser->m_vMaterials[iMat];
        if (mat.bNeed)
        {
            ai_assert(NULL != mat.pcInstance);
            pcScene->mMaterials[iNum] = mat.pcInstance;

            // Store the internal material, too
            pcIntMaterials[iNum] = &mat;

            // Iterate through all meshes and search for one which is using
            // this top-level material index
            for (unsigned int iMesh = 0; iMesh < pcScene->mNumMeshes;++iMesh)
            {
                aiMesh* mesh = pcScene->mMeshes[iMesh];
                if (ASE::Face::DEFAULT_MATINDEX == mesh->mMaterialIndex &&
                    iMat == (uintptr_t)mesh->mColors[3])
                {
                    mesh->mMaterialIndex = iNum;
                    mesh->mColors[3] = NULL;
                }
            }
            iNum++;
        }
        for (unsigned int iSubMat = 0; iSubMat < mat.avSubMaterials.size();++iSubMat)   {
            ASE::Material& submat = mat.avSubMaterials[iSubMat];
            if (submat.bNeed)   {
                ai_assert(NULL != submat.pcInstance);
                pcScene->mMaterials[iNum] = submat.pcInstance;

                // Store the internal material, too
                pcIntMaterials[iNum] = &submat;

                // Iterate through all meshes and search for one which is using
                // this sub-level material index
                for (unsigned int iMesh = 0; iMesh < pcScene->mNumMeshes;++iMesh)   {
                    aiMesh* mesh = pcScene->mMeshes[iMesh];

                    if (iSubMat == mesh->mMaterialIndex && iMat == (uintptr_t)mesh->mColors[3]) {
                        mesh->mMaterialIndex = iNum;
                        mesh->mColors[3]     = NULL;
                    }
                }
                iNum++;
            }
        }
    }

    // Delete our temporary array
    delete[] pcIntMaterials;
}